

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O3

vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_> *
__thiscall
Gudhi::Persistence_representations::Persistence_intervals::compute_persistent_betti_numbers
          (vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
           *__return_storage_ptr__,Persistence_intervals *this)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer __last;
  ulong uVar3;
  long lVar4;
  long lVar5;
  pointer ppVar6;
  long lVar7;
  vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_> places_where_pbs_change
  ;
  allocator_type local_31;
  vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_> local_30;
  
  std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>::vector
            (&local_30,
             (long)(this->intervals).
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->intervals).
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_31);
  __last = local_30.
           super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar6 = local_30.
           super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->intervals).
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->intervals).
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 4;
    lVar5 = 8;
    do {
      *(undefined8 *)
       ((long)&local_30.
               super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].first + lVar5 * 2) =
           *(undefined8 *)((long)ppVar1 + lVar5 + -8);
      *(undefined1 *)
       ((long)local_30.
              super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar5 * 2 + -8) = 1;
      *(undefined8 *)
       ((long)&(local_30.
                super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first + lVar5 * 2) =
           *(undefined8 *)((long)&ppVar1->first + lVar5);
      (&(local_30.
         super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->second)[lVar5 * 2] = false;
      lVar5 = lVar5 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (local_30.
      super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_30.
      super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    uVar3 = (long)local_30.
                  super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_30.
                  super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar4 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,bool>*,std::vector<std::pair<double,bool>,std::allocator<std::pair<double,bool>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,bool>const&,std::pair<double,bool>const&)>>
              ((__normal_iterator<std::pair<double,_bool>_*,_std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>_>
                )local_30.
                 super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::pair<double,_bool>_*,_std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>_>
                )local_30.
                 super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e
               ,(_Iter_comp_iter<bool_(*)(const_std::pair<double,_bool>_&,_const_std::pair<double,_bool>_&)>
                 )0x10427f);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,bool>*,std::vector<std::pair<double,bool>,std::allocator<std::pair<double,bool>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<double,bool>const&,std::pair<double,bool>const&)>>
              ((__normal_iterator<std::pair<double,_bool>_*,_std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>_>
                )ppVar6,(__normal_iterator<std::pair<double,_bool>_*,_std::vector<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>_>
                         )__last,
               (_Iter_comp_iter<bool_(*)(const_std::pair<double,_bool>_&,_const_std::pair<double,_bool>_&)>
                )0x10427f);
    ppVar6 = local_30.
             super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ::vector(__return_storage_ptr__,
           (long)ppVar6 -
           (long)local_30.
                 super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_31);
  if ((long)local_30.
            super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_30.
            super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    if (local_30.
        super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>.
        _M_impl.super__Vector_impl_data._M_start == (pair<double,_bool> *)0x0) {
      return __return_storage_ptr__;
    }
  }
  else {
    lVar4 = (long)local_30.
                  super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_30.
                  super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    ppVar2 = (__return_storage_ptr__->
             super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 8;
    lVar7 = 0;
    do {
      lVar7 = lVar7 + ((ulong)*(byte *)((long)&(local_30.
                                                super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->first +
                                       lVar5) - 1 | 1);
      *(undefined8 *)((long)ppVar2 + lVar5 + -8) =
           *(undefined8 *)
            ((long)local_30.
                   super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8);
      *(long *)((long)&ppVar2->first + lVar5) = lVar7;
      lVar5 = lVar5 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  operator_delete(local_30.
                  super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_30.
                        super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_30.
                        super__Vector_base<std::pair<double,_bool>,_std::allocator<std::pair<double,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, size_t> > Persistence_intervals::compute_persistent_betti_numbers() const {
  std::vector<std::pair<double, bool> > places_where_pbs_change(2 * this->intervals.size());

  for (size_t i = 0; i != this->intervals.size(); ++i) {
    places_where_pbs_change[2 * i] = std::make_pair(this->intervals[i].first, true);
    places_where_pbs_change[2 * i + 1] = std::make_pair(this->intervals[i].second, false);
  }

  std::sort(places_where_pbs_change.begin(), places_where_pbs_change.end(), compare_first_element_of_pair<double>);
  size_t pbn = 0;
  std::vector<std::pair<double, size_t> > pbns(places_where_pbs_change.size());
  for (size_t i = 0; i != places_where_pbs_change.size(); ++i) {
    if (places_where_pbs_change[i].second == true) {
      ++pbn;
    } else {
      --pbn;
    }
    pbns[i] = std::make_pair(places_where_pbs_change[i].first, pbn);
  }
  return pbns;
}